

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthread.cpp
# Opt level: O2

void __thiscall QThread::exit(QThread *this,int __status)

{
  QObjectData *pQVar1;
  QObject *pQVar2;
  int i;
  _func_int **pp_Var3;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QObject).d_ptr.d;
  local_30._0_8_ = &pQVar1[1].children.d.size;
  local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
  local_30[8] = true;
  *(undefined1 *)
   ((long)&pQVar1[1].postedEvents.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1) = 1;
  *(int *)((long)&pQVar1[1].metaObject + 4) = __status;
  pQVar2 = pQVar1[2].q_ptr;
  *(undefined1 *)((long)&pQVar2[8].d_ptr.d + 4) = 1;
  for (pp_Var3 = (_func_int **)0x0; pp_Var3 < pQVar2[1]._vptr_QObject;
      pp_Var3 = (_func_int **)((long)pp_Var3 + 1)) {
    QEventLoop::exit((QEventLoop *)(&((pQVar2->d_ptr).d)->_vptr_QObjectData)[(long)pp_Var3],__status
                    );
    pQVar2 = pQVar1[2].q_ptr;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThread::exit(int returnCode)
{
    Q_D(QThread);
    QMutexLocker locker(&d->mutex);
    d->exited = true;
    d->returnCode = returnCode;
    d->data->quitNow = true;
    for (int i = 0; i < d->data->eventLoops.size(); ++i) {
        QEventLoop *eventLoop = d->data->eventLoops.at(i);
        eventLoop->exit(returnCode);
    }
}